

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void ARGB4444ToYRow_C(uint8_t *src_argb4444,uint8_t *dst_y,int width)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  
  if (0 < width) {
    lVar2 = 0;
    do {
      bVar1 = src_argb4444[lVar2 * 2];
      bVar3 = bVar1 << 4 | bVar1 & 0xf;
      bVar4 = src_argb4444[lVar2 * 2 + 1] << 4 | src_argb4444[lVar2 * 2 + 1] & 0xf;
      dst_y[lVar2] = (uint8_t)(((uint)bVar3 + (uint)bVar3 * 4) * 5 +
                               (uint)(byte)(bVar1 & 0xf0 | bVar1 >> 4) * 0x81 +
                               (uint)bVar4 * 0x40 + (uint)bVar4 * 2 + 0x1080 >> 8);
      lVar2 = lVar2 + 1;
    } while (width != (int)lVar2);
  }
  return;
}

Assistant:

void ARGB4444ToYRow_C(const uint8_t* src_argb4444, uint8_t* dst_y, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_argb4444[0] & 0x0f;
    uint8_t g = src_argb4444[0] >> 4;
    uint8_t r = src_argb4444[1] & 0x0f;
    b = (b << 4) | b;
    g = (g << 4) | g;
    r = (r << 4) | r;
    dst_y[0] = RGBToY(r, g, b);
    src_argb4444 += 2;
    dst_y += 1;
  }
}